

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Declaration *decl)

{
  enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
  *__return_storage_ptr__;
  DeclarationData *this_00;
  int iVar1;
  LengthData *data;
  long in_FS_OFFSET;
  LengthData LVar2;
  undefined1 local_58 [16];
  enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
  local_48;
  long local_28;
  
  data = (LengthData *)local_58;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (decl->d).d.ptr;
  if (*(ulong *)&(this_00->parsed).d.field_0x18 < 4) {
    if ((this_00->values).d.size == 0) {
      iVar1 = 0;
      goto LAB_0053e91a;
    }
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    LVar2 = lengthValue((ValueExtractor *)this_00,(Value *)((QPalette *)&(this_00->values).d.ptr)->d
                       );
    local_58._0_8_ = LVar2.number;
    local_58._8_4_ = LVar2.unit;
    __return_storage_ptr__ =
         (enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
          *)(local_58 + 0x10);
    ::QVariant::fromValue<QCss::LengthData>(__return_storage_ptr__,(LengthData *)local_58);
    ::QVariant::operator=(&((decl->d).d.ptr)->parsed,__return_storage_ptr__);
    ::QVariant::~QVariant(__return_storage_ptr__);
  }
  else {
    LVar2 = qvariant_cast<QCss::LengthData>(&this_00->parsed);
    local_48.d.data.shared = (PrivateShared *)LVar2.number;
    data = (LengthData *)(local_58 + 0x10);
    local_48.d.data._8_4_ = LVar2.unit;
  }
  iVar1 = lengthValueFromData(data,&this->f);
LAB_0053e91a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int ValueExtractor::lengthValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid())
        return  lengthValueFromData(qvariant_cast<LengthData>(decl.d->parsed), f);
    if (decl.d->values.size() < 1)
        return 0;
    LengthData data = lengthValue(decl.d->values.at(0));
    decl.d->parsed = QVariant::fromValue<LengthData>(data);
    return lengthValueFromData(data,f);
}